

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

optional<long> __thiscall
anon_unknown.dwarf_1461ac2::WSHDescriptor::MaxSatSize(WSHDescriptor *this,bool use_max_sig)

{
  long lVar1;
  _Storage<long,_true> _Var2;
  long lVar3;
  ulong uVar4;
  undefined8 uVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  optional<long> oVar8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  auVar6 = (**(code **)(*(long *)(((this->super_DescriptorImpl).m_subdescriptor_args.
                                   super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                 super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                                 ._M_t + 0xa0))();
  _Var2._M_value = auVar6._0_8_;
  if ((auVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    auVar7 = (**(code **)(*(long *)(((this->super_DescriptorImpl).m_subdescriptor_args.
                                     super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                   super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                                   ._M_t + 0x60))();
    uVar4 = auVar7._8_8_;
    _Var2._M_value = auVar7._0_8_;
    if ((auVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      lVar3 = 1;
      if ((0xfc < (ulong)_Var2) && (lVar3 = 3, 0xffff < (ulong)_Var2)) {
        uVar4 = (ulong)_Var2._M_value >> 0x20;
        lVar3 = (ulong)(uVar4 != 0) * 4 + 5;
      }
      _Var2._M_value = _Var2._M_value + auVar6._0_8_ + lVar3;
      uVar5 = CONCAT71((int7)(uVar4 >> 8),1);
      goto LAB_0039f82a;
    }
  }
  uVar5 = 0;
LAB_0039f82a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    oVar8.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_
         = uVar5;
    oVar8.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = _Var2._M_value;
    return (optional<long>)
           oVar8.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> MaxSatSize(bool use_max_sig) const override {
        if (const auto sat_size = m_subdescriptor_args[0]->MaxSatSize(use_max_sig)) {
            if (const auto subscript_size = m_subdescriptor_args[0]->ScriptSize()) {
                return GetSizeOfCompactSize(*subscript_size) + *subscript_size + *sat_size;
            }
        }
        return {};
    }